

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O1

void state_TEXM3X3(Context *ctx)

{
  uint uVar1;
  
  uVar1 = 0;
  if (ctx->minor_ver != 0xff) {
    uVar1 = (uint)ctx->minor_ver;
  }
  if ((uVar1 | (uint)ctx->major_ver << 0x10) < 0x10002) {
    failf(ctx,"%s","TEXM3X3 opcode not available in Shader Model 1.1");
  }
  state_texm3x3(ctx,"TEXM3X3",0);
  return;
}

Assistant:

static void state_TEXM3X3(Context *ctx)
{
    if (!shader_version_atleast(ctx, 1, 2))
        fail(ctx, "TEXM3X3 opcode not available in Shader Model 1.1");
    state_texm3x3(ctx, "TEXM3X3", 0);
}